

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_rsassa_pkcs1_v15_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong uVar1;
  size_t sVar2;
  uchar uVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  mbedtls_rsa_context *ctx_00;
  byte bVar7;
  int iVar8;
  mbedtls_md_info_t *md_info;
  uchar *output;
  uchar *output_00;
  size_t sVar9;
  long lVar10;
  ulong __n;
  char *oid;
  size_t local_58;
  mbedtls_rsa_context *local_50;
  char *local_48;
  _func_int_void_ptr_uchar_ptr_size_t *local_40;
  void *local_38;
  
  local_58 = 0;
  local_48 = (char *)0x0;
  if ((mode != 1) || (iVar8 = -0x4080, ctx->padding == 0)) {
    uVar1 = ctx->len;
    lVar10 = uVar1 - 3;
    local_50 = ctx;
    local_40 = f_rng;
    local_38 = p_rng;
    if (md_alg != MBEDTLS_MD_NONE) {
      md_info = mbedtls_md_info_from_type(md_alg);
      if ((md_info == (mbedtls_md_info_t *)0x0) ||
         (iVar8 = mbedtls_oid_get_oid_by_md(md_alg,&local_48,&local_58), iVar8 != 0)) {
        bVar4 = false;
      }
      else {
        lVar10 = (uVar1 - local_58) + -0xd;
        bVar7 = mbedtls_md_get_size(md_info);
        hashlen = (uint)bVar7;
        bVar4 = true;
      }
      if (!bVar4) {
        return -0x4080;
      }
    }
    __n = lVar10 - (ulong)hashlen;
    iVar8 = -0x4080;
    if (__n <= uVar1 && 7 < __n) {
      sig[0] = '\0';
      sig[1] = '\x01';
      memset(sig + 2,0xff,__n);
      sVar6 = local_58;
      sig[__n + 2] = '\0';
      if (md_alg == MBEDTLS_MD_NONE) {
        lVar10 = __n + 3;
      }
      else {
        sig[__n + 3] = '0';
        uVar3 = (uchar)local_58;
        sig[__n + 4] = uVar3 + (uchar)hashlen + '\b';
        sig[__n + 5] = '0';
        sig[__n + 6] = uVar3 + '\x04';
        sig[__n + 7] = '\x06';
        sig[__n + 8] = uVar3;
        memcpy(sig + __n + 9,local_48,local_58);
        lVar5 = sVar6 + __n + 2;
        lVar10 = lVar5 + 0xb;
        (sig + lVar5 + 7)[0] = '\x05';
        (sig + lVar5 + 7)[1] = '\0';
        sig[lVar5 + 9] = '\x04';
        sig[lVar5 + 10] = (uchar)hashlen;
      }
      memcpy(sig + lVar10,hash,(ulong)hashlen);
      ctx_00 = local_50;
      if (mode == 0) {
        iVar8 = mbedtls_rsa_public(local_50,sig,sig);
      }
      else {
        sVar2 = local_50->len;
        output = (uchar *)calloc(1,sVar2);
        output_00 = (uchar *)calloc(1,sVar2);
        iVar8 = -0x10;
        if (output_00 != (uchar *)0x0 && output != (uchar *)0x0) {
          iVar8 = mbedtls_rsa_private(ctx_00,local_40,local_38,sig,output);
          if ((iVar8 == 0) && (iVar8 = mbedtls_rsa_public(ctx_00,output,output_00), iVar8 == 0)) {
            sVar2 = ctx_00->len;
            bVar7 = 0;
            if (sVar2 != 0) {
              sVar9 = 0;
              bVar7 = 0;
              do {
                bVar7 = bVar7 | sig[sVar9] ^ output_00[sVar9];
                sVar9 = sVar9 + 1;
              } while (sVar2 != sVar9);
            }
            iVar8 = -0x4300;
            if (bVar7 == 0) {
              memcpy(sig,output,sVar2);
              iVar8 = 0;
            }
          }
          free(output);
          free(output_00);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_sign( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               unsigned char *sig )
{
    size_t nb_pad, olen, oid_size = 0;
    unsigned char *p = sig;
    const char *oid = NULL;
    unsigned char *sig_try = NULL, *verif = NULL;
    size_t i;
    unsigned char diff;
    volatile unsigned char diff_no_optimize;
    int ret;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;
    nb_pad = olen - 3;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        if( mbedtls_oid_get_oid_by_md( md_alg, &oid, &oid_size ) != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        nb_pad -= 10 + oid_size;

        hashlen = mbedtls_md_get_size( md_info );
    }

    nb_pad -= hashlen;

    if( ( nb_pad < 8 ) || ( nb_pad > olen ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset( p, 0xFF, nb_pad );
    p += nb_pad;
    *p++ = 0;

    if( md_alg == MBEDTLS_MD_NONE )
    {
        memcpy( p, hash, hashlen );
    }
    else
    {
        /*
         * DigestInfo ::= SEQUENCE {
         *   digestAlgorithm DigestAlgorithmIdentifier,
         *   digest Digest }
         *
         * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
         *
         * Digest ::= OCTET STRING
         */
        *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
        *p++ = (unsigned char) ( 0x08 + oid_size + hashlen );
        *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
        *p++ = (unsigned char) ( 0x04 + oid_size );
        *p++ = MBEDTLS_ASN1_OID;
        *p++ = oid_size & 0xFF;
        memcpy( p, oid, oid_size );
        p += oid_size;
        *p++ = MBEDTLS_ASN1_NULL;
        *p++ = 0x00;
        *p++ = MBEDTLS_ASN1_OCTET_STRING;
        *p++ = hashlen;
        memcpy( p, hash, hashlen );
    }

    if( mode == MBEDTLS_RSA_PUBLIC )
        return( mbedtls_rsa_public(  ctx, sig, sig ) );

    /*
     * In order to prevent Lenstra's attack, make the signature in a
     * temporary buffer and check it before returning it.
     */
    sig_try = mbedtls_calloc( 1, ctx->len );
    verif   = mbedtls_calloc( 1, ctx->len );
    if( sig_try == NULL || verif == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    MBEDTLS_MPI_CHK( mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig_try ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_public( ctx, sig_try, verif ) );

    /* Compare in constant time just in case */
    for( diff = 0, i = 0; i < ctx->len; i++ )
        diff |= verif[i] ^ sig[i];
    diff_no_optimize = diff;

    if( diff_no_optimize != 0 )
    {
        ret = MBEDTLS_ERR_RSA_PRIVATE_FAILED;
        goto cleanup;
    }

    memcpy( sig, sig_try, ctx->len );

cleanup:
    mbedtls_free( sig_try );
    mbedtls_free( verif );

    return( ret );
}